

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

int Ssw_SmlNodeCountOnesRealVec(Ssw_Sml_t *p,Vec_Ptr_t *vObjs)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = vObjs->nSize;
  iVar2 = 0;
  if ((ulong)uVar1 != 0) {
    lVar3 = (long)p->nWordsTotal;
    iVar2 = 0;
    if (0 < lVar3) {
      lVar5 = 0;
      iVar2 = 0;
      do {
        uVar4 = 0;
        if (0 < (int)uVar1) {
          uVar7 = 0;
          uVar4 = 0;
          do {
            uVar6 = (ulong)vObjs->pArray[uVar7] & 0xfffffffffffffffe;
            uVar4 = uVar4 | -(((uint)vObjs->pArray[uVar7] ^ *(uint *)(uVar6 + 0x18) >> 3) & 1) ^
                            *(uint *)((long)&p[1].pAig +
                                     *(int *)(uVar6 + 0x24) * lVar3 * 4 + lVar5 * 4);
            uVar7 = uVar7 + 1;
          } while (uVar1 != uVar7);
        }
        uVar4 = (uVar4 >> 1 & 0x55555555) + (uVar4 & 0x55555555);
        uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
        uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
        uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
        iVar2 = iVar2 + (uVar4 >> 0x10) + (uVar4 & 0xffff);
        lVar5 = lVar5 + 1;
      } while (lVar5 != lVar3);
    }
  }
  return iVar2;
}

Assistant:

int Ssw_SmlNodeCountOnesRealVec( Ssw_Sml_t * p, Vec_Ptr_t * vObjs )
{
    Aig_Obj_t * pObj;
    unsigned * pSims, uWord;
    int i, k, Counter = 0;
    if ( Vec_PtrSize(vObjs) == 0 )
        return 0;
    for ( i = 0; i < p->nWordsTotal; i++ )
    {
        uWord = 0;
        Vec_PtrForEachEntry( Aig_Obj_t *, vObjs, pObj, k )
        {
            pSims = Ssw_ObjSim(p, Aig_Regular(pObj)->Id);
            if ( Aig_Regular(pObj)->fPhase ^ Aig_IsComplement(pObj) )
                uWord |= ~pSims[i];
            else
                uWord |= pSims[i];
        }
        Counter += Aig_WordCountOnes( uWord );
    }
    return Counter;
}